

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::scalar_advection_update(PeleLM *this,Real dt,int first_scalar,int last_scalar)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  undefined8 in_XMM0_Qa;
  Array4<const_double> *ext_src;
  Array4<const_double> *adv;
  Array4<const_double> *sold;
  Array4<double> *snew;
  Box *bx;
  MFIter mfi;
  MultiFab *S_old;
  MultiFab *S_new;
  Real new_time;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  AmrLevel *in_stack_fffffffffffffcf0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffcf8;
  StateData *in_stack_fffffffffffffd10;
  FabArrayBase *pFVar2;
  FabArrayBase *in_stack_fffffffffffffd18;
  MFIter *in_stack_fffffffffffffd20;
  anon_class_272_7_1528adb3 *in_stack_fffffffffffffd38;
  Box *in_stack_fffffffffffffd40;
  MFIter *in_stack_fffffffffffffd50;
  undefined1 auStack_2a8 [64];
  undefined1 auStack_268 [64];
  undefined1 auStack_228 [64];
  undefined8 local_1e8;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [64];
  undefined1 *local_198;
  undefined1 local_190 [64];
  undefined1 *local_150;
  undefined1 local_148 [64];
  undefined1 *local_108;
  undefined1 local_100 [28];
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  Real in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  MultiFab *in_stack_ffffffffffffff38;
  AmrLevel *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff50;
  MultiFab *local_30;
  FabArrayBase *local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_fffffffffffffcf0,CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
            );
  local_20 = amrex::StateData::curTime(in_stack_fffffffffffffd10);
  local_28 = (FabArrayBase *)
             amrex::AmrLevel::get_new_data(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
  local_30 = amrex::AmrLevel::get_old_data(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
  pFVar2 = local_28;
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,SUB81((ulong)pFVar2 >> 0x38,0));
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)&stack0xffffffffffffff70);
    if (!bVar1) break;
    amrex::MFIter::tilebox(in_stack_fffffffffffffd50);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffcf8,(MFIter *)in_stack_fffffffffffffcf0);
    in_stack_ffffffffffffff40 = (AmrLevel *)local_100;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffcf8,(MFIter *)in_stack_fffffffffffffcf0);
    local_108 = local_148;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffcf8,(MFIter *)in_stack_fffffffffffffcf0);
    local_150 = local_190;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffcf8,(MFIter *)in_stack_fffffffffffffcf0);
    local_198 = local_1d8;
    memcpy(&stack0xfffffffffffffd18,in_stack_ffffffffffffff40,0x3c);
    memcpy(auStack_2a8,local_108,0x3c);
    memcpy(auStack_268,local_150,0x3c);
    memcpy(auStack_228,local_198,0x3c);
    local_1e8 = local_10;
    local_1e0 = local_14;
    local_1dc = local_18;
    amrex::ParallelFor<PeleLM::scalar_advection_update(double,int,int)::__0>
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    amrex::MFIter::operator++((MFIter *)&stack0xffffffffffffff70);
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffcf0);
  amrex::FabArrayBase::nGrow(local_28,0);
  amrex::AmrLevel::FillPatch
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff50);
  return;
}

Assistant:

void
PeleLM::scalar_advection_update (Real dt,
                                 int  first_scalar,
                                 int  last_scalar)
{
   //
   // Careful: If here, the sign of aofs is flipped (wrt the usual NS treatment).
   //
   const Real new_time   = state[State_Type].curTime();
   MultiFab&       S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
       const Box& bx   = mfi.tilebox();
       auto const& snew   = S_new.array(mfi);
       auto const& sold   = S_old.const_array(mfi);
       auto const& adv    = aofs->const_array(mfi);
       auto const& ext_src = external_sources.const_array(mfi);

       amrex::ParallelFor(bx, [snew, sold, adv, ext_src, dt, first_scalar, last_scalar]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
           for (int n = first_scalar; n <= last_scalar; n++) {
               snew(i,j,k,n) = sold(i,j,k,n) + dt * (adv(i,j,k,n) + ext_src(i,j,k,n));
           }
       });
   }

   // Let's FillPatch the new class state density, so that it's ready for anyone using it further down in the SDC ite.
   FillPatch(*this,S_new,S_new.nGrow(),new_time,State_Type,Density,1,Density);
}